

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_soft_max_ext_back(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  int64_t iVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  byte bVar22;
  char cVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  void *pvVar27;
  long lVar28;
  ulong uVar29;
  char *pcVar30;
  long lVar31;
  float *x;
  long lVar32;
  undefined8 uVar33;
  int np;
  float *y;
  ushort uVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  float local_150;
  uint local_14c;
  undefined1 local_148 [16];
  long local_138;
  ulong local_130;
  ulong local_128;
  ggml_tensor *local_120;
  ulong local_118;
  ggml_tensor *local_110;
  ggml_tensor *local_108;
  void *local_100;
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  pgVar4 = dst->src[0];
  if (pgVar4->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x12f9,"fatal error");
  }
  pgVar5 = dst->src[1];
  cVar23 = ggml_is_contiguous(pgVar4);
  if (cVar23 == '\0') {
    pcVar30 = "ggml_is_contiguous(src0)";
    uVar33 = 0x129f;
  }
  else {
    cVar23 = ggml_is_contiguous(pgVar5);
    if (cVar23 == '\0') {
      pcVar30 = "ggml_is_contiguous(src1)";
      uVar33 = 0x12a0;
    }
    else {
      cVar23 = ggml_is_contiguous(dst);
      if (cVar23 == '\0') {
        pcVar30 = "ggml_is_contiguous(dst)";
        uVar33 = 0x12a1;
      }
      else {
        cVar23 = ggml_are_same_shape(pgVar4,dst);
        if (cVar23 == '\0') {
          pcVar30 = "ggml_are_same_shape(src0, dst)";
          uVar33 = 0x12a2;
        }
        else {
          cVar23 = ggml_are_same_shape(pgVar5,dst);
          if (cVar23 == '\0') {
            pcVar30 = "ggml_are_same_shape(src1, dst)";
            uVar33 = 0x12a3;
          }
          else {
            local_108 = pgVar5;
            if (((float)dst->op_params[1] == 0.0) && (!NAN((float)dst->op_params[1]))) {
              local_148 = ZEXT416((uint)dst->op_params[0]);
              iVar3 = params->ith;
              iVar25 = params->nth;
              iVar6 = pgVar4->ne[0];
              local_110 = dst;
              uVar24 = ggml_nrows(pgVar4);
              iVar25 = (int)(iVar25 + -1 + uVar24) / iVar25;
              lVar32 = (long)iVar3 * (long)iVar25;
              uVar26 = iVar25 + (int)lVar32;
              if ((int)uVar24 <= (int)uVar26) {
                uVar26 = uVar24;
              }
              local_118 = (ulong)uVar26;
              if ((int)lVar32 < (int)uVar26) {
                uVar26 = (uint)iVar6;
                local_14c = uVar26 & 0xffffffc0;
                auVar35 = vpbroadcastd_avx512f(ZEXT416((uint)local_148._0_4_));
                lVar28 = (long)(int)local_14c;
                lVar31 = (long)(int)uVar26;
                if ((long)(int)uVar26 < lVar28 + 1) {
                  lVar31 = lVar28 + 1;
                }
                local_130 = (ulong)(uVar26 + 0xf & 0xfffffff0);
                auVar36 = vpbroadcastq_avx512f();
                auVar37 = vpbroadcastq_avx512f();
                local_138 = lVar28 << 2;
                local_128 = (lVar31 - lVar28) + 0xfU & 0xfffffffffffffff0;
                local_78 = vmovdqu64_avx512f(auVar35);
                local_b8 = vmovdqu64_avx512f(auVar36);
                local_f8 = vmovdqu64_avx512f(auVar37);
                local_120 = pgVar4;
                do {
                  local_148._0_8_ = lVar32;
                  y = (float *)(local_120->nb[1] * lVar32 + (long)local_120->data);
                  x = (float *)(local_108->nb[1] * lVar32 + (long)local_108->data);
                  sVar7 = local_110->nb[1];
                  local_100 = local_110->data;
                  local_150 = 0.0;
                  ggml_vec_dot_f32(uVar26,&local_150,0,x,0,y,0,1);
                  auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar37 = vmovdqu64_avx512f(local_b8);
                  if (0 < (int)uVar26) {
                    lVar32 = sVar7 * local_148._0_8_;
                    uVar29 = 0;
                    do {
                      *(float *)((long)local_100 + uVar29 * 4 + lVar32) = y[uVar29];
                      uVar29 = uVar29 + 1;
                    } while ((uVar26 & 0x7fffffff) != uVar29);
                    if (0 < (int)uVar26) {
                      auVar38 = vbroadcastss_avx512f(ZEXT416((uint)local_150));
                      uVar29 = 0;
                      do {
                        auVar39 = vpbroadcastq_avx512f();
                        auVar40 = vporq_avx512f(auVar39,auVar36);
                        auVar39 = vporq_avx512f(auVar39,auVar35);
                        uVar33 = vpcmpuq_avx512f(auVar39,auVar37,2);
                        bVar21 = (byte)uVar33;
                        uVar33 = vpcmpuq_avx512f(auVar40,auVar37,2);
                        bVar22 = (byte)uVar33;
                        uVar34 = CONCAT11(bVar22,bVar21);
                        piVar1 = (int *)((long)local_100 + uVar29 * 4 + lVar32);
                        auVar39._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * piVar1[1];
                        auVar39._0_4_ = (uint)(bVar21 & 1) * *piVar1;
                        auVar39._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * piVar1[2];
                        auVar39._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * piVar1[3];
                        auVar39._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * piVar1[4];
                        auVar39._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * piVar1[5];
                        auVar39._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * piVar1[6];
                        auVar39._28_4_ = (uint)((byte)(uVar34 >> 7) & 1) * piVar1[7];
                        auVar39._32_4_ = (uint)(bVar22 & 1) * piVar1[8];
                        auVar39._36_4_ = (uint)(bVar22 >> 1 & 1) * piVar1[9];
                        auVar39._40_4_ = (uint)(bVar22 >> 2 & 1) * piVar1[10];
                        auVar39._44_4_ = (uint)(bVar22 >> 3 & 1) * piVar1[0xb];
                        auVar39._48_4_ = (uint)(bVar22 >> 4 & 1) * piVar1[0xc];
                        auVar39._52_4_ = (uint)(bVar22 >> 5 & 1) * piVar1[0xd];
                        auVar39._56_4_ = (uint)(bVar22 >> 6 & 1) * piVar1[0xe];
                        auVar39._60_4_ = (uint)(bVar22 >> 7) * piVar1[0xf];
                        auVar39 = vsubps_avx512f(auVar39,auVar38);
                        puVar2 = (uint *)((long)local_100 + uVar29 * 4 + lVar32);
                        bVar8 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar9 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar10 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar11 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar12 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar13 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar15 = (bool)(bVar22 >> 1 & 1);
                        bVar16 = (bool)(bVar22 >> 2 & 1);
                        bVar17 = (bool)(bVar22 >> 3 & 1);
                        bVar18 = (bool)(bVar22 >> 4 & 1);
                        bVar19 = (bool)(bVar22 >> 5 & 1);
                        bVar20 = (bool)(bVar22 >> 6 & 1);
                        *puVar2 = (uint)(bVar21 & 1) * auVar39._0_4_ |
                                  (uint)!(bool)(bVar21 & 1) * *puVar2;
                        puVar2[1] = (uint)bVar8 * auVar39._4_4_ | (uint)!bVar8 * puVar2[1];
                        puVar2[2] = (uint)bVar9 * auVar39._8_4_ | (uint)!bVar9 * puVar2[2];
                        puVar2[3] = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * puVar2[3];
                        puVar2[4] = (uint)bVar11 * auVar39._16_4_ | (uint)!bVar11 * puVar2[4];
                        puVar2[5] = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * puVar2[5];
                        puVar2[6] = (uint)bVar13 * auVar39._24_4_ | (uint)!bVar13 * puVar2[6];
                        puVar2[7] = (uint)bVar14 * auVar39._28_4_ | (uint)!bVar14 * puVar2[7];
                        puVar2[8] = (uint)(bVar22 & 1) * auVar39._32_4_ |
                                    (uint)!(bool)(bVar22 & 1) * puVar2[8];
                        puVar2[9] = (uint)bVar15 * auVar39._36_4_ | (uint)!bVar15 * puVar2[9];
                        puVar2[10] = (uint)bVar16 * auVar39._40_4_ | (uint)!bVar16 * puVar2[10];
                        puVar2[0xb] = (uint)bVar17 * auVar39._44_4_ | (uint)!bVar17 * puVar2[0xb];
                        puVar2[0xc] = (uint)bVar18 * auVar39._48_4_ | (uint)!bVar18 * puVar2[0xc];
                        puVar2[0xd] = (uint)bVar19 * auVar39._52_4_ | (uint)!bVar19 * puVar2[0xd];
                        puVar2[0xe] = (uint)bVar20 * auVar39._56_4_ | (uint)!bVar20 * puVar2[0xe];
                        puVar2[0xf] = (uint)(bVar22 >> 7) * auVar39._60_4_ |
                                      (uint)!(bool)(bVar22 >> 7) * puVar2[0xf];
                        uVar29 = uVar29 + 0x10;
                      } while (local_130 != uVar29);
                      if (0 < (int)uVar26) {
                        uVar29 = 0;
                        do {
                          *(float *)((long)local_100 + uVar29 * 4 + lVar32) =
                               *(float *)((long)local_100 + uVar29 * 4 + lVar32) * x[uVar29];
                          uVar29 = uVar29 + 1;
                        } while ((uVar26 & 0x7fffffff) != uVar29);
                      }
                    }
                  }
                  auVar37 = vmovdqu64_avx512f(local_f8);
                  if (0 < (int)local_14c) {
                    pvVar27 = (void *)(sVar7 * local_148._0_8_ + (long)local_100);
                    uVar29 = 0;
                    do {
                      lVar32 = 0;
                      do {
                        auVar38 = vmulps_avx512f(local_78,*(undefined1 (*) [64])
                                                           ((long)pvVar27 + lVar32));
                        *(undefined1 (*) [64])((long)pvVar27 + lVar32) = auVar38;
                        lVar32 = lVar32 + 0x40;
                      } while (lVar32 != 0x100);
                      uVar29 = uVar29 + 0x40;
                      pvVar27 = (void *)((long)pvVar27 + 0x100);
                    } while (uVar29 < (uVar26 & 0xffffffc0));
                  }
                  if (local_14c != uVar26) {
                    lVar32 = sVar7 * local_148._0_8_ + local_138;
                    uVar29 = 0;
                    do {
                      auVar38 = vpbroadcastq_avx512f();
                      auVar39 = vporq_avx512f(auVar38,auVar36);
                      auVar38 = vporq_avx512f(auVar38,auVar35);
                      uVar33 = vpcmpuq_avx512f(auVar38,auVar37,2);
                      bVar21 = (byte)uVar33;
                      uVar33 = vpcmpuq_avx512f(auVar39,auVar37,2);
                      bVar22 = (byte)uVar33;
                      uVar34 = CONCAT11(bVar22,bVar21);
                      piVar1 = (int *)((long)local_100 + uVar29 * 4 + lVar32);
                      auVar38._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * piVar1[1];
                      auVar38._0_4_ = (uint)(bVar21 & 1) * *piVar1;
                      auVar38._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * piVar1[2];
                      auVar38._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * piVar1[3];
                      auVar38._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * piVar1[4];
                      auVar38._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * piVar1[5];
                      auVar38._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * piVar1[6];
                      auVar38._28_4_ = (uint)((byte)(uVar34 >> 7) & 1) * piVar1[7];
                      auVar38._32_4_ = (uint)(bVar22 & 1) * piVar1[8];
                      auVar38._36_4_ = (uint)(bVar22 >> 1 & 1) * piVar1[9];
                      auVar38._40_4_ = (uint)(bVar22 >> 2 & 1) * piVar1[10];
                      auVar38._44_4_ = (uint)(bVar22 >> 3 & 1) * piVar1[0xb];
                      auVar38._48_4_ = (uint)(bVar22 >> 4 & 1) * piVar1[0xc];
                      auVar38._52_4_ = (uint)(bVar22 >> 5 & 1) * piVar1[0xd];
                      auVar38._56_4_ = (uint)(bVar22 >> 6 & 1) * piVar1[0xe];
                      auVar38._60_4_ = (uint)(bVar22 >> 7) * piVar1[0xf];
                      auVar38 = vmulps_avx512f(local_78,auVar38);
                      puVar2 = (uint *)((long)local_100 + uVar29 * 4 + lVar32);
                      bVar8 = (bool)((byte)(uVar34 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar34 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar34 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar34 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar34 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar34 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar34 >> 7) & 1);
                      bVar15 = (bool)(bVar22 >> 1 & 1);
                      bVar16 = (bool)(bVar22 >> 2 & 1);
                      bVar17 = (bool)(bVar22 >> 3 & 1);
                      bVar18 = (bool)(bVar22 >> 4 & 1);
                      bVar19 = (bool)(bVar22 >> 5 & 1);
                      bVar20 = (bool)(bVar22 >> 6 & 1);
                      *puVar2 = (uint)(bVar21 & 1) * auVar38._0_4_ |
                                (uint)!(bool)(bVar21 & 1) * *puVar2;
                      puVar2[1] = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * puVar2[1];
                      puVar2[2] = (uint)bVar9 * auVar38._8_4_ | (uint)!bVar9 * puVar2[2];
                      puVar2[3] = (uint)bVar10 * auVar38._12_4_ | (uint)!bVar10 * puVar2[3];
                      puVar2[4] = (uint)bVar11 * auVar38._16_4_ | (uint)!bVar11 * puVar2[4];
                      puVar2[5] = (uint)bVar12 * auVar38._20_4_ | (uint)!bVar12 * puVar2[5];
                      puVar2[6] = (uint)bVar13 * auVar38._24_4_ | (uint)!bVar13 * puVar2[6];
                      puVar2[7] = (uint)bVar14 * auVar38._28_4_ | (uint)!bVar14 * puVar2[7];
                      puVar2[8] = (uint)(bVar22 & 1) * auVar38._32_4_ |
                                  (uint)!(bool)(bVar22 & 1) * puVar2[8];
                      puVar2[9] = (uint)bVar15 * auVar38._36_4_ | (uint)!bVar15 * puVar2[9];
                      puVar2[10] = (uint)bVar16 * auVar38._40_4_ | (uint)!bVar16 * puVar2[10];
                      puVar2[0xb] = (uint)bVar17 * auVar38._44_4_ | (uint)!bVar17 * puVar2[0xb];
                      puVar2[0xc] = (uint)bVar18 * auVar38._48_4_ | (uint)!bVar18 * puVar2[0xc];
                      puVar2[0xd] = (uint)bVar19 * auVar38._52_4_ | (uint)!bVar19 * puVar2[0xd];
                      puVar2[0xe] = (uint)bVar20 * auVar38._56_4_ | (uint)!bVar20 * puVar2[0xe];
                      puVar2[0xf] = (uint)(bVar22 >> 7) * auVar38._60_4_ |
                                    (uint)!(bool)(bVar22 >> 7) * puVar2[0xf];
                      uVar29 = uVar29 + 0x10;
                    } while (local_128 != uVar29);
                  }
                  lVar32 = local_148._0_8_ + 1;
                } while ((int)local_118 != (int)lVar32);
              }
              return;
            }
            pcVar30 = "max_bias == 0.0f";
            uVar33 = 0x12ab;
          }
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar33,"GGML_ASSERT(%s) failed",pcVar30);
}

Assistant:

void ggml_compute_forward_soft_max_ext_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_soft_max_ext_back_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}